

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,int64_t value)

{
  ScriptOperator *this_00;
  long lVar1;
  long lVar2;
  ScriptType data_type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  ScriptOperator local_58;
  
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_00888040;
  this->type_ = kElementNumber;
  this_00 = &this->op_code_;
  ScriptOperator::ScriptOperator(this_00,kOpInvalidOpCode);
  ByteData::ByteData(&this->binary_data_);
  this->value_ = value;
  if (0x11 < value + 1U) goto LAB_0032fb64;
  if (value == -1) {
    data_type = kOp1Negate;
  }
  else if (value < 1) {
    data_type = kOpFalse;
  }
  else {
    data_type = (int)value + kOpReserved;
  }
  if (g_operator_map._40_8_ == 0) {
LAB_0032fb05:
    ScriptOperator::ScriptOperator(&local_58,data_type);
    if (this_00 != &local_58) {
      (this->op_code_).data_type_ = local_58.data_type_;
      ::std::__cxx11::string::_M_assign((string *)&(this->op_code_).text_data_);
    }
    local_58._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_0087c308;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.text_data_._M_dataplus._M_p != &local_58.text_data_.field_2) {
      operator_delete(local_58.text_data_._M_dataplus._M_p,
                      local_58.text_data_.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    lVar1 = 0x8b2298;
    if (g_operator_map._16_8_ != 0) {
      lVar1 = 0x8b2298;
      lVar2 = g_operator_map._16_8_;
      do {
        if ((int)data_type <= *(int *)(lVar2 + 0x20)) {
          lVar1 = lVar2;
        }
        lVar2 = *(long *)(lVar2 + 0x10 + (ulong)(*(int *)(lVar2 + 0x20) < (int)data_type) * 8);
      } while (lVar2 != 0);
    }
    lVar2 = 0x8b2298;
    if ((lVar1 != 0x8b2298) && (lVar2 = 0x8b2298, *(int *)(lVar1 + 0x20) <= (int)data_type)) {
      lVar2 = lVar1;
    }
    if (lVar2 == 0x8b2298) goto LAB_0032fb05;
    if (this_00 != (ScriptOperator *)(lVar2 + 0x28)) {
      (this->op_code_).data_type_ = *(ScriptType *)(lVar2 + 0x30);
      ::std::__cxx11::string::_M_assign((string *)&(this->op_code_).text_data_);
    }
  }
  if ((this->op_code_).data_type_ != kOpInvalidOpCode) {
    this->type_ = kElementOpCode;
  }
LAB_0032fb64:
  if (this->type_ == kElementNumber) {
    SerializeScriptNum(&local_70,this->value_);
    ByteData::ByteData((ByteData *)&local_58,&local_70);
    ByteData::operator=(&this->binary_data_,(ByteData *)&local_58);
    if (local_58._vptr_ScriptOperator != (_func_int **)0x0) {
      operator_delete(local_58._vptr_ScriptOperator,
                      (long)local_58.text_data_._M_dataplus._M_p -
                      (long)local_58._vptr_ScriptOperator);
    }
    if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

ScriptElement::ScriptElement(int64_t value)
    : type_(kElementNumber),
      op_code_(kOpInvalidOpCode),
      binary_data_(),
      value_(value) {
  if ((value >= -1) && (value <= 16)) {
    int32_t op_code = static_cast<int32_t>(kOp_0);
    if (value == -1) {
      op_code = static_cast<int32_t>(kOp1Negate);

    } else if (value >= 1) {
      op_code = static_cast<int32_t>(kOp_1);
      op_code += static_cast<int32_t>(value) - 1;
    }

    ScriptType key = static_cast<ScriptType>(op_code);
    bool is_find = false;
    if (!g_operator_map.empty()) {
      decltype(g_operator_map)::const_iterator ite = g_operator_map.find(key);
      if (ite != g_operator_map.end()) {
        op_code_ = ite->second;
        is_find = true;
      }
    }
    if (!is_find) {
      op_code_ = ScriptOperator(key);
    }
    if (op_code_.GetDataType() != kOpInvalidOpCode) {
      type_ = kElementOpCode;
    }
  }

  if (type_ == kElementNumber) {
    // set binary data
    binary_data_ = ByteData(SerializeScriptNum(value_));
  }
}